

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_animatable_timesamples<tinyusdz::value::normal3f>
                   (string *__return_storage_ptr__,Animatable<tinyusdz::value::normal3f> *v,
                   uint32_t indent)

{
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  if ((v->_ts)._dirty == true) {
    TypedTimeSamples<tinyusdz::value::normal3f>::update(&v->_ts);
  }
  if ((v->_ts)._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (v->_ts)._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    print_typed_timesamples<tinyusdz::value::normal3f>(&local_1d0,&v->_ts,indent);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_timesamples(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  std::stringstream ss;

  if (v.has_timesamples()) {
    ss << print_typed_timesamples(v.get_timesamples(), indent);
  }

  return ss.str();
}